

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestOrderOnlyDeps::Run(BuildTestOrderOnlyDeps *this)

{
  State *state;
  VirtualFileSystem *this_00;
  int *piVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  int iVar2;
  Edge *this_02;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  Node *pNVar6;
  string err;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  Builder *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_BuildTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule cc\n  command = cc $in\n  depfile = $out.d\nbuild foo.o: cc foo.c || otherfile\n"
              ,(ManifestParserOptions)0x0);
  iVar5 = g_current_test->assertion_failures_;
  if (iVar2 == iVar5) {
    this_02 = (*(pointer *)
                ((long)&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_.edges_.
                        super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                        super__Vector_impl_data + 8))[-1];
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"foo.c",&local_99);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9a);
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"otherfile",&local_99);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9a);
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"foo.o.d",&local_99);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"foo.o: blah.h bar.h\n",&local_9a);
    VirtualFileSystem::Create(this_00,&local_98,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"foo.o",(allocator<char> *)&local_78);
    local_58 = &(this->super_BuildTest).builder_;
    pNVar6 = Builder::AddTarget(local_58,&local_98,&local_50);
    testing::Test::Check
              (pTVar3,pNVar6 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x3f9,"builder_.AddTarget(\"foo.o\", &err)");
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_50);
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x3fa,"\"\" == err");
    if ((bVar4) &&
       (bVar4 = testing::Test::Check
                          (g_current_test,
                           (long)(this_02->inputs_).
                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(this_02->inputs_).
                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                 super__Vector_impl_data._M_start == 0x20,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x3fd,"4u == edge->inputs_.size()"), bVar4)) {
      testing::Test::Check
                (g_current_test,this_02->implicit_deps_ == 2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x3fe,"2 == edge->implicit_deps_");
      testing::Test::Check
                (g_current_test,this_02->order_only_deps_ == 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x3ff,"1 == edge->order_only_deps_");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("foo.c",&(*(this_02->inputs_).
                                         super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                                         .super__Vector_impl_data._M_start)->path_);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x402,"\"foo.c\" == edge->inputs_[0]->path()");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("blah.h",&(this_02->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_start[1]->path_);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x403,"\"blah.h\" == edge->inputs_[1]->path()");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("bar.h",&(this_02->inputs_).
                                       super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                       super__Vector_impl_data._M_start[2]->path_);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x404,"\"bar.h\" == edge->inputs_[2]->path()");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("otherfile",
                              &(this_02->inputs_).
                               super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                               super__Vector_impl_data._M_start[3]->path_);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0x405,"\"otherfile\" == edge->inputs_[3]->path()");
      pTVar3 = g_current_test;
      Edge::EvaluateCommand_abi_cxx11_(&local_98,this_02,false);
      bVar4 = std::operator==("cc foo.c",&local_98);
      bVar4 = testing::Test::Check
                        (pTVar3,bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x408,"\"cc foo.c\" == edge->EvaluateCommand()");
      std::__cxx11::string::~string((string *)&local_98);
      pTVar3 = g_current_test;
      if (bVar4) {
        bVar4 = Builder::Build(local_58,&local_50);
        testing::Test::Check
                  (pTVar3,bVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x40b,"builder_.Build(&err)");
        pTVar3 = g_current_test;
        bVar4 = std::operator==("",&local_50);
        bVar4 = testing::Test::Check
                          (pTVar3,bVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                           ,0x40c,"\"\" == err");
        if ((bVar4) &&
           (bVar4 = testing::Test::Check
                              (g_current_test,
                               (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start == 0x20,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0x40d,"1u == command_runner_.commands_ran_.size()"), bVar4)) {
          piVar1 = &(this->super_BuildTest).fs_.now_;
          *piVar1 = *piVar1 + 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"foo.o.d",&local_99);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"foo.o: blah.h bar.h\n",&local_9a);
          VirtualFileSystem::Create(this_00,&local_98,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"blah.h",&local_99)
          ;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9a);
          VirtualFileSystem::Create(this_00,&local_98,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"bar.h",&local_99);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9a);
          VirtualFileSystem::Create(this_00,&local_98,&local_78);
          this_01 = &(this->super_BuildTest).command_runner_.commands_ran_;
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(this_01);
          State::Reset(state);
          pTVar3 = g_current_test;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"foo.o",(allocator<char> *)&local_78);
          pNVar6 = Builder::AddTarget(local_58,&local_98,&local_50);
          testing::Test::Check
                    (pTVar3,pNVar6 != (Node *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x419,"builder_.AddTarget(\"foo.o\", &err)");
          std::__cxx11::string::~string((string *)&local_98);
          pTVar3 = g_current_test;
          bVar4 = Builder::Build(local_58,&local_50);
          testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x41a,"builder_.Build(&err)");
          pTVar3 = g_current_test;
          bVar4 = std::operator==("",&local_50);
          bVar4 = testing::Test::Check
                            (pTVar3,bVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                             ,0x41b,"\"\" == err");
          if ((bVar4) &&
             (bVar4 = testing::Test::Check
                                (g_current_test,
                                 (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start == 0x20,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                 ,0x41c,"1u == command_runner_.commands_ran_.size()"), bVar4)) {
            piVar1 = &(this->super_BuildTest).fs_.now_;
            *piVar1 = *piVar1 + 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"foo.o.d",&local_99);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"foo.o: blah.h bar.h\n",&local_9a);
            VirtualFileSystem::Create(this_00,&local_98,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"otherfile",&local_99);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_9a);
            VirtualFileSystem::Create(this_00,&local_98,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_98);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(this_01);
            State::Reset(state);
            pTVar3 = g_current_test;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"foo.o",(allocator<char> *)&local_78);
            pNVar6 = Builder::AddTarget(local_58,&local_98,&local_50);
            testing::Test::Check
                      (pTVar3,pNVar6 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x427,"builder_.AddTarget(\"foo.o\", &err)");
            std::__cxx11::string::~string((string *)&local_98);
            pTVar3 = g_current_test;
            bVar4 = std::operator==("",&local_50);
            testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x428,"\"\" == err");
            pTVar3 = g_current_test;
            bVar4 = Builder::AlreadyUpToDate(local_58);
            testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x429,"builder_.AlreadyUpToDate()");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"bar.h",(allocator<char> *)&local_78);
            VirtualFileSystem::RemoveFile(this_00,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(this_01);
            State::Reset(state);
            pTVar3 = g_current_test;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"foo.o",(allocator<char> *)&local_78);
            pNVar6 = Builder::AddTarget(local_58,&local_98,&local_50);
            testing::Test::Check
                      (pTVar3,pNVar6 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x42f,"builder_.AddTarget(\"foo.o\", &err)");
            std::__cxx11::string::~string((string *)&local_98);
            pTVar3 = g_current_test;
            bVar4 = Builder::Build(local_58,&local_50);
            testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x430,"builder_.Build(&err)");
            pTVar3 = g_current_test;
            bVar4 = std::operator==("",&local_50);
            bVar4 = testing::Test::Check
                              (pTVar3,bVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                               ,0x431,"\"\" == err");
            if ((bVar4) &&
               (bVar4 = testing::Test::Check
                                  (g_current_test,
                                   (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start == 0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                                   ,0x432,"1u == command_runner_.commands_ran_.size()"), bVar4))
            goto LAB_00129e60;
          }
        }
      }
    }
    iVar5 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar5 + 1;
LAB_00129e60:
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TEST_F(BuildTest, OrderOnlyDeps) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n  command = cc $in\n  depfile = $out.d\n"
"build foo.o: cc foo.c || otherfile\n"));
  Edge* edge = state_.edges_.back();

  fs_.Create("foo.c", "");
  fs_.Create("otherfile", "");
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  ASSERT_EQ("", err);

  // One explicit, two implicit, one order only.
  ASSERT_EQ(4u, edge->inputs_.size());
  EXPECT_EQ(2, edge->implicit_deps_);
  EXPECT_EQ(1, edge->order_only_deps_);
  // Verify the inputs are in the order we expect
  // (explicit then implicit then orderonly).
  EXPECT_EQ("foo.c", edge->inputs_[0]->path());
  EXPECT_EQ("blah.h", edge->inputs_[1]->path());
  EXPECT_EQ("bar.h", edge->inputs_[2]->path());
  EXPECT_EQ("otherfile", edge->inputs_[3]->path());

  // Expect the command line we generate to only use the original input.
  ASSERT_EQ("cc foo.c", edge->EvaluateCommand());

  // explicit dep dirty, expect a rebuild.
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  fs_.Tick();

  // Recreate the depfile, as it should have been deleted by the build.
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");

  // implicit dep dirty, expect a rebuild.
  fs_.Create("blah.h", "");
  fs_.Create("bar.h", "");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  fs_.Tick();

  // Recreate the depfile, as it should have been deleted by the build.
  fs_.Create("foo.o.d", "foo.o: blah.h bar.h\n");

  // order only dep dirty, no rebuild.
  fs_.Create("otherfile", "");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  // implicit dep missing, expect rebuild.
  fs_.RemoveFile("bar.h");
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("foo.o", &err));
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
}